

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void TDPParseTrace(FILE *TraceFILE,char *zTracePrompt)

{
  char *zTracePrompt_local;
  FILE *TraceFILE_local;
  
  yyTraceFILE = TraceFILE;
  if (TraceFILE == (FILE *)0x0) {
    yyTracePrompt = (char *)0x0;
  }
  else {
    yyTracePrompt = zTracePrompt;
    if (zTracePrompt == (char *)0x0) {
      yyTraceFILE = (FILE *)0x0;
    }
  }
  return;
}

Assistant:

void TDPParseTrace(FILE * TraceFILE, char * zTracePrompt) {
	yyTraceFILE = TraceFILE;
	yyTracePrompt = zTracePrompt;

	if ( yyTraceFILE == 0 ) {
		yyTracePrompt = 0;
	} else if ( yyTracePrompt == 0 ) {
		yyTraceFILE = 0;
	}
}